

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestSpec * Catch::parseTestSpec(TestSpec *__return_storage_ptr__,string *arg)

{
  TestSpecParser local_f8;
  
  local_f8.m_tagAliases = ITagAliasRegistry::get();
  local_f8.m_arg._M_dataplus._M_p = (pointer)&local_f8.m_arg.field_2;
  local_f8.m_mode = None;
  local_f8.lastMode = None;
  local_f8.m_exclusion = false;
  local_f8.m_pos = 0;
  local_f8.m_realPatternPos = 0;
  local_f8.m_arg._M_string_length = 0;
  local_f8.m_arg.field_2._M_local_buf[0] = '\0';
  local_f8.m_substring._M_dataplus._M_p = (pointer)&local_f8.m_substring.field_2;
  local_f8.m_substring._M_string_length = 0;
  local_f8.m_substring.field_2._M_local_buf[0] = '\0';
  local_f8.m_patternName._M_dataplus._M_p = (pointer)&local_f8.m_patternName.field_2;
  local_f8.m_patternName._M_string_length = 0;
  local_f8.m_patternName.field_2._M_local_buf[0] = '\0';
  local_f8.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_currentFilter.m_patterns.
  super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_currentFilter.m_patterns.
  super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_currentFilter.m_patterns.
  super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_testSpec.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_testSpec.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_testSpec.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestSpecParser::parse(&local_f8,arg);
  TestSpecParser::testSpec(__return_storage_ptr__,&local_f8);
  TestSpecParser::~TestSpecParser(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

TestSpec parseTestSpec( std::string const& arg ) {
        return TestSpecParser( ITagAliasRegistry::get() ).parse( arg ).testSpec();
    }